

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkrequest.cpp
# Opt level: O0

bool __thiscall
QHttpNetworkRequestPrivate::operator==
          (QHttpNetworkRequestPrivate *this,QHttpNetworkRequestPrivate *other)

{
  bool bVar1;
  QByteArray *in_RSI;
  QHttpNetworkHeaderPrivate *in_RDI;
  QHttpNetworkHeaderPrivate *in_stack_ffffffffffffffd8;
  uint7 in_stack_ffffffffffffffe8;
  bool bVar2;
  
  bVar1 = QHttpNetworkHeaderPrivate::operator==(in_RDI,in_stack_ffffffffffffffd8);
  bVar2 = false;
  if ((bVar1) &&
     (bVar2 = false,
     in_RDI[1].super_QSharedData.ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
     _q_value.super___atomic_base<int>._M_i == (int)in_RSI[3].d.size)) {
    bVar1 = ::operator==((QString *)in_RDI,(QString *)in_stack_ffffffffffffffd8);
    bVar2 = false;
    if ((((bVar1) &&
         (((bVar2 = false, in_RDI[1].parser.minorVersion == *(int *)&in_RSI[6].d.d &&
           (bVar2 = false, (char *)in_RDI[1].parser.maxFieldSize == in_RSI[6].d.ptr)) &&
          (bVar2 = false, ((byte)in_RDI[1].parser.maxTotalSize & 1) == ((byte)in_RSI[6].d.size & 1))
          ))) && (((bVar2 = false,
                   (*(byte *)((long)&in_RDI[1].parser.maxTotalSize + 1) & 1) ==
                   (*(byte *)((long)&in_RSI[6].d.size + 1) & 1) &&
                   (bVar2 = false,
                   (*(byte *)((long)&in_RDI[1].parser.maxTotalSize + 2) & 1) ==
                   (*(byte *)((long)&in_RSI[6].d.size + 2) & 1))) &&
                  (bVar2 = false,
                  (*(byte *)((long)&in_RDI[1].parser.maxTotalSize + 3) & 1) ==
                  (*(byte *)((long)&in_RSI[6].d.size + 3) & 1))))) &&
       (bVar2 = false,
       (*(byte *)((long)&in_RDI[1].parser.maxTotalSize + 4) & 1) ==
       (*(byte *)((long)&in_RSI[6].d.size + 4) & 1))) {
      if ((in_RDI[1].super_QSharedData.ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
           _q_value.super___atomic_base<int>._M_i == 8) &&
         (bVar1 = ::operator==(in_RSI,(QByteArray *)(ulong)in_stack_ffffffffffffffe8), !bVar1)) {
        return false;
      }
      bVar2 = false;
      if (((((*(byte *)((long)&in_RDI[1].parser.maxTotalSize + 5) & 1) ==
             (*(byte *)((long)&in_RSI[6].d.size + 5) & 1)) &&
           (bVar2 = false,
           (*(byte *)((long)&in_RDI[1].parser.maxTotalSize + 6) & 1) ==
           (*(byte *)((long)&in_RSI[6].d.size + 6) & 1))) &&
          (bVar2 = false,
          (*(byte *)((long)&in_RDI[1].parser.maxTotalSize + 7) & 1) ==
          (*(byte *)((long)&in_RSI[6].d.size + 7) & 1))) &&
         (bVar2 = false,
         in_RDI[2].super_QSharedData.ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
         _q_value.super___atomic_base<int>._M_i == *(int *)&in_RSI[7].d.ptr)) {
        bVar1 = ::operator==((QString *)in_RDI,(QString *)in_stack_ffffffffffffffd8);
        bVar2 = false;
        if (bVar1) {
          bVar2 = ((byte)in_RDI[1].parser.maxFieldCount & 1) == (*(byte *)&in_RSI[7].d.d & 1);
        }
      }
    }
  }
  return bVar2;
}

Assistant:

bool QHttpNetworkRequestPrivate::operator==(const QHttpNetworkRequestPrivate &other) const
{
    return QHttpNetworkHeaderPrivate::operator==(other)
        && (operation == other.operation)
        && (fullLocalServerName == other.fullLocalServerName)
        && (priority == other.priority)
        && (uploadByteDevice == other.uploadByteDevice)
        && (autoDecompress == other.autoDecompress)
        && (pipeliningAllowed == other.pipeliningAllowed)
        && (http2Allowed == other.http2Allowed)
        && (http2Direct == other.http2Direct)
        && (h2cAllowed == other.h2cAllowed)
        // we do not clear the customVerb in setOperation
        && (operation != QHttpNetworkRequest::Custom || (customVerb == other.customVerb))
        && (withCredentials == other.withCredentials)
        && (ssl == other.ssl)
        && (preConnect == other.preConnect)
        && (redirectPolicy == other.redirectPolicy)
        && (peerVerifyName == other.peerVerifyName)
        && (needResendWithCredentials == other.needResendWithCredentials)
        ;
}